

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O2

InputInfo * __thiscall helics::InterfaceInfo::getInput(InterfaceInfo *this,string *inputName)

{
  InputInfo *pIVar1;
  handle local_28;
  
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(&local_28,&this->inputs);
  pIVar1 = gmlc::containers::
           DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(local_28.data,inputName);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_28.m_handle_lock);
  return pIVar1;
}

Assistant:

InputInfo* InterfaceInfo::getInput(const std::string& inputName)
{
    return inputs.lock()->find(inputName);
}